

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void get_ref_frame_use_mask
               (AV1_COMP *cpi,MACROBLOCK *x,MB_MODE_INFO *mi,int mi_row,int mi_col,BLOCK_SIZE bsize,
               int gf_temporal_ref,int *use_ref_frame,int *force_skip_low_temp_var)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  int in_stack_00000008;
  long in_stack_00000010;
  int buffslot_golden;
  int pred;
  int thr;
  int use_last_ref_frame;
  int use_golden_ref_frame;
  int use_alt_ref_frame;
  int is_small_sb;
  segmentation *seg;
  AV1_COMMON *cm;
  int local_64;
  uint local_60;
  uint local_5c;
  bool local_55;
  uint local_48;
  int local_44;
  uint local_40;
  
  local_55 = true;
  if (*(int *)(*in_RDI + 0x14dc0) == 0) {
    local_55 = *(int *)((long)in_RDI + 0x60cb4) != 0;
  }
  local_40 = (uint)local_55;
  local_44 = 1;
  local_48 = 1;
  if (*(int *)(*in_RDI + 0x14dc0) != 0) {
    local_5c = (uint)((*(uint *)(in_RDI + 0xc117) & 1) != 0);
    local_48 = local_5c;
  }
  if ((((*(int *)(*in_RDI + 0x14dc0) == 0) && (local_48 != 0)) &&
      (*(int *)((long)in_RDI + 0x60784) == 0)) && (in_stack_00000008 != 0)) {
    local_44 = 0;
  }
  if (((local_48 != 0) && (*(int *)((long)in_RDI + 0x60ccc) != 0)) &&
     (*(int *)(in_RSI + 0x17200) != 0)) {
    if (*(char *)(in_RDI[0x8401] + 0x1c) == '\f') {
      iVar1 = av1_get_force_skip_low_temp_var_small_sb
                        ((uint8_t *)(in_RSI + 0x18ba0),in_ECX,in_R8D,in_R9B);
      *_pred = iVar1;
    }
    else {
      iVar1 = av1_get_force_skip_low_temp_var((uint8_t *)(in_RSI + 0x18ba0),in_ECX,in_R8D,in_R9B);
      *_pred = iVar1;
    }
    if (*_pred != 0) {
      local_44 = 0;
      local_40 = 0;
    }
  }
  if ((local_48 != 0) &&
     (((2 < *(int *)(in_RSI + 0x17200) || (*(int *)(in_RSI + 0x15244) != 0)) ||
      ((1 < *(int *)(in_RSI + 0x17200) && (BLOCK_64X64 < in_R9B)))))) {
    local_44 = 0;
    local_40 = 0;
  }
  iVar1 = segfeature_active((segmentation *)(in_RDI + 0x8137),
                            (byte)*(undefined2 *)(in_RDX + 0xa7) & 7,'\x05');
  if ((iVar1 != 0) &&
     (iVar1 = get_segdata((segmentation *)(in_RDI + 0x8137),
                          (uint)((byte)*(undefined2 *)(in_RDX + 0xa7) & 7),'\x05'), iVar1 == 4)) {
    local_44 = 1;
    local_40 = 0;
  }
  if ((local_48 != 0) &&
     (((*(int *)((long)in_RDI + 0x4269c) == 1 && (*(int *)(in_RSI + 0x17200) != 0)) ||
      ((*(uint *)(in_RSI + 0x25640) < 200 && (1 < *(uint *)(in_RSI + 0x15d60))))))) {
    if ((*(char *)(in_RSI + 0x25622) == '\x01') || (*(char *)(in_RSI + 0x25623) == '\x01')) {
      local_44 = 0;
    }
    if ((*(char *)(in_RSI + 0x25624) == '\x01') || (*(char *)(in_RSI + 0x25625) == '\x01')) {
      local_40 = 0;
    }
  }
  if ((((*(int *)((long)in_RDI + 0x4269c) != 1) && ((*(uint *)(in_RDI + 0xc117) & 1) != 0)) &&
      (local_44 == 0)) &&
     (((local_40 == 0 && (*(int *)(in_RSI + 0x15d74) != 0x7fffffff)) &&
      ((2 < *(int *)(in_RSI + 0x17200) &&
       ((*(char *)(in_RSI + 0x25622) == '\0' && (*(char *)(in_RSI + 0x25623) == '\0')))))))) {
    iVar1 = 0x96;
    if (0x18c00 < (int)in_RDI[0x77f7] * *(int *)((long)in_RDI + 0x3bfbc)) {
      iVar1 = 100;
    }
    if (iVar1 < *(int *)(in_RSI + 0x15d74) >> (""[in_R9B] + ""[in_R9B] & 0x1f)) {
      local_44 = 1;
    }
  }
  if ((*(uint *)(in_RDI + 0xc117) & 0x40) == 0) {
    local_60 = 0;
  }
  else {
    local_60 = local_40;
  }
  if ((*(uint *)(in_RDI + 0xc117) & 8) == 0) {
    local_64 = 0;
  }
  else {
    local_64 = local_44;
  }
  local_44 = local_64;
  if ((((0 < (int)in_RDI[0x13a66]) && ((*(uint *)(in_RDI + 0xc117) & 8) != 0)) &&
      (*(uint *)(in_RSI + 0x15d60) < 4)) &&
     (*(int *)(*in_RDI + 0x14dd8 + (long)*(int *)(*in_RDI + 0x14d90) * 4) == (int)in_RDI[0x13a6b]))
  {
    local_44 = 1;
  }
  *(uint *)(in_stack_00000010 + 0x1c) = local_60;
  *(int *)(in_stack_00000010 + 0x10) = local_44;
  *(uint *)(in_stack_00000010 + 4) = local_48;
  return;
}

Assistant:

static inline void get_ref_frame_use_mask(AV1_COMP *cpi, MACROBLOCK *x,
                                          MB_MODE_INFO *mi, int mi_row,
                                          int mi_col, BLOCK_SIZE bsize,
                                          int gf_temporal_ref,
                                          int use_ref_frame[],
                                          int *force_skip_low_temp_var) {
  AV1_COMMON *const cm = &cpi->common;
  const struct segmentation *const seg = &cm->seg;
  const int is_small_sb = (cm->seq_params->sb_size == BLOCK_64X64);

  // When the ref_frame_config is used to set the reference frame structure
  // then the usage of alt_ref is determined by the ref_frame_flags
  // (and not the speed feature use_nonrd_altref_frame).
  int use_alt_ref_frame = cpi->ppi->rtc_ref.set_ref_frame_config ||
                          cpi->sf.rt_sf.use_nonrd_altref_frame;

  int use_golden_ref_frame = 1;
  int use_last_ref_frame = 1;

  // When the ref_frame_config is used to set the reference frame structure:
  // check if LAST is used as a reference. And only remove golden and altref
  // references below if last is used as a reference.
  if (cpi->ppi->rtc_ref.set_ref_frame_config)
    use_last_ref_frame =
        cpi->ref_frame_flags & AOM_LAST_FLAG ? use_last_ref_frame : 0;

  // frame_since_golden is not used when user sets the referene structure.
  if (!cpi->ppi->rtc_ref.set_ref_frame_config && use_last_ref_frame &&
      cpi->rc.frames_since_golden == 0 && gf_temporal_ref) {
    use_golden_ref_frame = 0;
  }

  if (use_last_ref_frame && cpi->sf.rt_sf.short_circuit_low_temp_var &&
      x->nonrd_prune_ref_frame_search) {
    if (is_small_sb)
      *force_skip_low_temp_var = av1_get_force_skip_low_temp_var_small_sb(
          &x->part_search_info.variance_low[0], mi_row, mi_col, bsize);
    else
      *force_skip_low_temp_var = av1_get_force_skip_low_temp_var(
          &x->part_search_info.variance_low[0], mi_row, mi_col, bsize);
    // If force_skip_low_temp_var is set, skip golden reference.
    if (*force_skip_low_temp_var) {
      use_golden_ref_frame = 0;
      use_alt_ref_frame = 0;
    }
  }

  if (use_last_ref_frame &&
      (x->nonrd_prune_ref_frame_search > 2 || x->force_zeromv_skip_for_blk ||
       (x->nonrd_prune_ref_frame_search > 1 && bsize > BLOCK_64X64))) {
    use_golden_ref_frame = 0;
    use_alt_ref_frame = 0;
  }

  if (segfeature_active(seg, mi->segment_id, SEG_LVL_REF_FRAME) &&
      get_segdata(seg, mi->segment_id, SEG_LVL_REF_FRAME) == GOLDEN_FRAME) {
    use_golden_ref_frame = 1;
    use_alt_ref_frame = 0;
  }

  // Skip golden/altref reference if color is set, on flat blocks with motion.
  // For screen: always skip golden/alt (if color_sensitivity_sb_g/alt is set)
  // except when x->nonrd_prune_ref_frame_search = 0. This latter flag
  // may be set in the variance partition when golden is a much better
  // reference than last, in which case it may not be worth skipping
  // golden/altref completely.
  // Condition on use_last_ref to make sure there remains at least one
  // reference.
  if (use_last_ref_frame &&
      ((cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
        x->nonrd_prune_ref_frame_search != 0) ||
       (x->source_variance < 200 &&
        x->content_state_sb.source_sad_nonrd >= kLowSad))) {
    if (x->color_sensitivity_sb_g[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
        x->color_sensitivity_sb_g[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)
      use_golden_ref_frame = 0;
    if (x->color_sensitivity_sb_alt[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
        x->color_sensitivity_sb_alt[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)
      use_alt_ref_frame = 0;
  }

  // For non-screen: if golden and altref are not being selected as references
  // (use_golden_ref_frame/use_alt_ref_frame = 0) check to allow golden back
  // based on the sad of nearest/nearmv of LAST ref. If this block sad is large,
  // keep golden as reference. Only do this for the agrressive pruning mode and
  // avoid it when color is set for golden reference.
  if (cpi->oxcf.tune_cfg.content != AOM_CONTENT_SCREEN &&
      (cpi->ref_frame_flags & AOM_LAST_FLAG) && !use_golden_ref_frame &&
      !use_alt_ref_frame && x->pred_mv_sad[LAST_FRAME] != INT_MAX &&
      x->nonrd_prune_ref_frame_search > 2 &&
      x->color_sensitivity_sb_g[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
      x->color_sensitivity_sb_g[COLOR_SENS_IDX(AOM_PLANE_V)] == 0) {
    int thr = (cm->width * cm->height > RESOLUTION_288P) ? 100 : 150;
    int pred = x->pred_mv_sad[LAST_FRAME] >>
               (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);
    if (pred > thr) use_golden_ref_frame = 1;
  }

  use_alt_ref_frame =
      cpi->ref_frame_flags & AOM_ALT_FLAG ? use_alt_ref_frame : 0;
  use_golden_ref_frame =
      cpi->ref_frame_flags & AOM_GOLD_FLAG ? use_golden_ref_frame : 0;

  // For spatial layers: enable golden ref if it is set by user and
  // corresponds to the lower spatial layer.
  if (cpi->svc.spatial_layer_id > 0 && (cpi->ref_frame_flags & AOM_GOLD_FLAG) &&
      x->content_state_sb.source_sad_nonrd < kHighSad) {
    const int buffslot_golden =
        cpi->ppi->rtc_ref.ref_idx[GOLDEN_FRAME - LAST_FRAME];
    if (cpi->ppi->rtc_ref.buffer_time_index[buffslot_golden] ==
        cpi->svc.current_superframe)
      use_golden_ref_frame = 1;
  }

  use_ref_frame[ALTREF_FRAME] = use_alt_ref_frame;
  use_ref_frame[GOLDEN_FRAME] = use_golden_ref_frame;
  use_ref_frame[LAST_FRAME] = use_last_ref_frame;
  // Keep this assert on, as only 3 references are used in nonrd_pickmode
  // (LAST, GOLDEN, ALTREF), and if all 3 are not set by user then this
  // frame must be an intra-only frame and hence should never enter the
  // pickmode here for inter frames.
  assert(use_last_ref_frame || use_golden_ref_frame || use_alt_ref_frame);
}